

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForcePlatforms.h
# Opt level: O1

void __thiscall
ezc3d::Modules::ForcePlatform::ForcePlatform(ForcePlatform *this,ForcePlatform *param_1)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pcVar3;
  undefined8 uVar4;
  pointer pVVar5;
  pointer pdVar6;
  
  paVar1 = &(this->_unitsForce).field_2;
  (this->_unitsForce)._M_dataplus._M_p = (pointer)paVar1;
  pcVar3 = (param_1->_unitsForce)._M_dataplus._M_p;
  paVar2 = &(param_1->_unitsForce).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 == paVar2) {
    uVar4 = *(undefined8 *)((long)&(param_1->_unitsForce).field_2 + 8);
    paVar1->_M_allocated_capacity = paVar2->_M_allocated_capacity;
    *(undefined8 *)((long)&(this->_unitsForce).field_2 + 8) = uVar4;
  }
  else {
    (this->_unitsForce)._M_dataplus._M_p = pcVar3;
    (this->_unitsForce).field_2._M_allocated_capacity = paVar2->_M_allocated_capacity;
  }
  (this->_unitsForce)._M_string_length = (param_1->_unitsForce)._M_string_length;
  (param_1->_unitsForce)._M_dataplus._M_p = (pointer)paVar2;
  (param_1->_unitsForce)._M_string_length = 0;
  (param_1->_unitsForce).field_2._M_local_buf[0] = '\0';
  paVar1 = &(this->_unitsMoment).field_2;
  (this->_unitsMoment)._M_dataplus._M_p = (pointer)paVar1;
  pcVar3 = (param_1->_unitsMoment)._M_dataplus._M_p;
  paVar2 = &(param_1->_unitsMoment).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 == paVar2) {
    uVar4 = *(undefined8 *)((long)&(param_1->_unitsMoment).field_2 + 8);
    paVar1->_M_allocated_capacity = paVar2->_M_allocated_capacity;
    *(undefined8 *)((long)&(this->_unitsMoment).field_2 + 8) = uVar4;
  }
  else {
    (this->_unitsMoment)._M_dataplus._M_p = pcVar3;
    (this->_unitsMoment).field_2._M_allocated_capacity = paVar2->_M_allocated_capacity;
  }
  (this->_unitsMoment)._M_string_length = (param_1->_unitsMoment)._M_string_length;
  (param_1->_unitsMoment)._M_dataplus._M_p = (pointer)paVar2;
  (param_1->_unitsMoment)._M_string_length = 0;
  (param_1->_unitsMoment).field_2._M_local_buf[0] = '\0';
  paVar1 = &(this->_unitsPosition).field_2;
  (this->_unitsPosition)._M_dataplus._M_p = (pointer)paVar1;
  pcVar3 = (param_1->_unitsPosition)._M_dataplus._M_p;
  paVar2 = &(param_1->_unitsPosition).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 == paVar2) {
    uVar4 = *(undefined8 *)((long)&(param_1->_unitsPosition).field_2 + 8);
    paVar1->_M_allocated_capacity = paVar2->_M_allocated_capacity;
    *(undefined8 *)((long)&(this->_unitsPosition).field_2 + 8) = uVar4;
  }
  else {
    (this->_unitsPosition)._M_dataplus._M_p = pcVar3;
    (this->_unitsPosition).field_2._M_allocated_capacity = paVar2->_M_allocated_capacity;
  }
  (this->_unitsPosition)._M_string_length = (param_1->_unitsPosition)._M_string_length;
  (param_1->_unitsPosition)._M_dataplus._M_p = (pointer)paVar2;
  (param_1->_unitsPosition)._M_string_length = 0;
  (param_1->_unitsPosition).field_2._M_local_buf[0] = '\0';
  this->_type = param_1->_type;
  Matrix::Matrix(&(this->_calMatrix).super_Matrix,&(param_1->_calMatrix).super_Matrix);
  (this->_calMatrix).super_Matrix._vptr_Matrix = (_func_int **)&PTR_print_0014d498;
  pVVar5 = (param_1->_corners).super__Vector_base<ezc3d::Vector3d,_std::allocator<ezc3d::Vector3d>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  (this->_corners).super__Vector_base<ezc3d::Vector3d,_std::allocator<ezc3d::Vector3d>_>._M_impl.
  super__Vector_impl_data._M_start =
       (param_1->_corners).super__Vector_base<ezc3d::Vector3d,_std::allocator<ezc3d::Vector3d>_>.
       _M_impl.super__Vector_impl_data._M_start;
  (this->_corners).super__Vector_base<ezc3d::Vector3d,_std::allocator<ezc3d::Vector3d>_>._M_impl.
  super__Vector_impl_data._M_finish = pVVar5;
  (this->_corners).super__Vector_base<ezc3d::Vector3d,_std::allocator<ezc3d::Vector3d>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (param_1->_corners).super__Vector_base<ezc3d::Vector3d,_std::allocator<ezc3d::Vector3d>_>.
       _M_impl.super__Vector_impl_data._M_end_of_storage;
  (param_1->_corners).super__Vector_base<ezc3d::Vector3d,_std::allocator<ezc3d::Vector3d>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (param_1->_corners).super__Vector_base<ezc3d::Vector3d,_std::allocator<ezc3d::Vector3d>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (param_1->_corners).super__Vector_base<ezc3d::Vector3d,_std::allocator<ezc3d::Vector3d>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  Matrix::Matrix(&(this->_meanCorners).super_Matrix,&(param_1->_meanCorners).super_Matrix);
  (this->_meanCorners).super_Matrix._vptr_Matrix = (_func_int **)&PTR_print_0014d590;
  Matrix::Matrix(&(this->_origin).super_Matrix,&(param_1->_origin).super_Matrix);
  (this->_origin).super_Matrix._vptr_Matrix = (_func_int **)&PTR_print_0014d590;
  Matrix::Matrix(&(this->_refFrame).super_Matrix,&(param_1->_refFrame).super_Matrix);
  (this->_refFrame).super_Matrix._vptr_Matrix = (_func_int **)&PTR_print_0014d290;
  pVVar5 = (param_1->_F).super__Vector_base<ezc3d::Vector3d,_std::allocator<ezc3d::Vector3d>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  (this->_F).super__Vector_base<ezc3d::Vector3d,_std::allocator<ezc3d::Vector3d>_>._M_impl.
  super__Vector_impl_data._M_start =
       (param_1->_F).super__Vector_base<ezc3d::Vector3d,_std::allocator<ezc3d::Vector3d>_>._M_impl.
       super__Vector_impl_data._M_start;
  (this->_F).super__Vector_base<ezc3d::Vector3d,_std::allocator<ezc3d::Vector3d>_>._M_impl.
  super__Vector_impl_data._M_finish = pVVar5;
  (this->_F).super__Vector_base<ezc3d::Vector3d,_std::allocator<ezc3d::Vector3d>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (param_1->_F).super__Vector_base<ezc3d::Vector3d,_std::allocator<ezc3d::Vector3d>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  (param_1->_F).super__Vector_base<ezc3d::Vector3d,_std::allocator<ezc3d::Vector3d>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (param_1->_F).super__Vector_base<ezc3d::Vector3d,_std::allocator<ezc3d::Vector3d>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (param_1->_F).super__Vector_base<ezc3d::Vector3d,_std::allocator<ezc3d::Vector3d>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  pVVar5 = (param_1->_M).super__Vector_base<ezc3d::Vector3d,_std::allocator<ezc3d::Vector3d>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  (this->_M).super__Vector_base<ezc3d::Vector3d,_std::allocator<ezc3d::Vector3d>_>._M_impl.
  super__Vector_impl_data._M_start =
       (param_1->_M).super__Vector_base<ezc3d::Vector3d,_std::allocator<ezc3d::Vector3d>_>._M_impl.
       super__Vector_impl_data._M_start;
  (this->_M).super__Vector_base<ezc3d::Vector3d,_std::allocator<ezc3d::Vector3d>_>._M_impl.
  super__Vector_impl_data._M_finish = pVVar5;
  (this->_M).super__Vector_base<ezc3d::Vector3d,_std::allocator<ezc3d::Vector3d>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (param_1->_M).super__Vector_base<ezc3d::Vector3d,_std::allocator<ezc3d::Vector3d>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  (param_1->_M).super__Vector_base<ezc3d::Vector3d,_std::allocator<ezc3d::Vector3d>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (param_1->_M).super__Vector_base<ezc3d::Vector3d,_std::allocator<ezc3d::Vector3d>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (param_1->_M).super__Vector_base<ezc3d::Vector3d,_std::allocator<ezc3d::Vector3d>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  pVVar5 = (param_1->_CoP).super__Vector_base<ezc3d::Vector3d,_std::allocator<ezc3d::Vector3d>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  (this->_CoP).super__Vector_base<ezc3d::Vector3d,_std::allocator<ezc3d::Vector3d>_>._M_impl.
  super__Vector_impl_data._M_start =
       (param_1->_CoP).super__Vector_base<ezc3d::Vector3d,_std::allocator<ezc3d::Vector3d>_>._M_impl
       .super__Vector_impl_data._M_start;
  (this->_CoP).super__Vector_base<ezc3d::Vector3d,_std::allocator<ezc3d::Vector3d>_>._M_impl.
  super__Vector_impl_data._M_finish = pVVar5;
  (this->_CoP).super__Vector_base<ezc3d::Vector3d,_std::allocator<ezc3d::Vector3d>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (param_1->_CoP).super__Vector_base<ezc3d::Vector3d,_std::allocator<ezc3d::Vector3d>_>._M_impl
       .super__Vector_impl_data._M_end_of_storage;
  (param_1->_CoP).super__Vector_base<ezc3d::Vector3d,_std::allocator<ezc3d::Vector3d>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (param_1->_CoP).super__Vector_base<ezc3d::Vector3d,_std::allocator<ezc3d::Vector3d>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (param_1->_CoP).super__Vector_base<ezc3d::Vector3d,_std::allocator<ezc3d::Vector3d>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  pVVar5 = (param_1->_Tz).super__Vector_base<ezc3d::Vector3d,_std::allocator<ezc3d::Vector3d>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  (this->_Tz).super__Vector_base<ezc3d::Vector3d,_std::allocator<ezc3d::Vector3d>_>._M_impl.
  super__Vector_impl_data._M_start =
       (param_1->_Tz).super__Vector_base<ezc3d::Vector3d,_std::allocator<ezc3d::Vector3d>_>._M_impl.
       super__Vector_impl_data._M_start;
  (this->_Tz).super__Vector_base<ezc3d::Vector3d,_std::allocator<ezc3d::Vector3d>_>._M_impl.
  super__Vector_impl_data._M_finish = pVVar5;
  (this->_Tz).super__Vector_base<ezc3d::Vector3d,_std::allocator<ezc3d::Vector3d>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (param_1->_Tz).super__Vector_base<ezc3d::Vector3d,_std::allocator<ezc3d::Vector3d>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  (param_1->_Tz).super__Vector_base<ezc3d::Vector3d,_std::allocator<ezc3d::Vector3d>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (param_1->_Tz).super__Vector_base<ezc3d::Vector3d,_std::allocator<ezc3d::Vector3d>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (param_1->_Tz).super__Vector_base<ezc3d::Vector3d,_std::allocator<ezc3d::Vector3d>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  pdVar6 = (param_1->_type3copPoly).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_finish;
  (this->_type3copPoly).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start =
       (param_1->_type3copPoly).super__Vector_base<double,_std::allocator<double>_>._M_impl.
       super__Vector_impl_data._M_start;
  (this->_type3copPoly).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = pdVar6;
  (this->_type3copPoly).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (param_1->_type3copPoly).super__Vector_base<double,_std::allocator<double>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  (param_1->_type3copPoly).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (param_1->_type3copPoly).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (param_1->_type3copPoly).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  return;
}

Assistant:

class EZC3D_VISIBILITY ezc3d::Modules::ForcePlatform {
  //---- CONSTRUCTORS ----//
public:
  ///
  /// \brief Default constructor
  ///
  EZC3D_API ForcePlatform();

  ///
  /// \brief Declare a ForcePlatForm analyse
  /// \param idx Index of the force platform
  /// \param c3d A reference to the c3d class
  ///
  EZC3D_API ForcePlatform(size_t idx, const ezc3d::c3d &c3d);

  //---- UNITS ----//
protected:
  std::string _unitsForce;    ///< Units for the forces
  std::string _unitsMoment;   ///< Units for the moments
  std::string _unitsPosition; ///< Units for the positions

public:
  ///
  /// \brief Return the units for the forces
  /// \return
  ///
  EZC3D_API const std::string &forceUnit() const;

  ///
  /// \brief Return the units for the moments
  /// \return
  ///
  EZC3D_API const std::string &momentUnit() const;

  ///
  /// \brief Return the units for the center of pressure, corners, origin
  /// \return
  ///
  EZC3D_API const std::string &positionUnit() const;

protected:
  ///
  /// \brief Extract the units for the platform
  /// \param idx Index of the platform
  /// \param c3d A reference to the c3d
  ///
  void extractUnits(const ezc3d::c3d &c3d);

  //---- DATA ----//
protected:
  size_t _type; ///< The type of force platform (see C3D documentation)
  ezc3d::Matrix66 _calMatrix; ///< The calibration matrix
  std::vector<ezc3d::Vector3d>
      _corners; ///< Position of the 4 corners of the force platform
  ezc3d::Vector3d
      _meanCorners; ///< Mean position of the corners of the force platform
  ezc3d::Vector3d _origin;   ///< Position of the origin of the force platform
  ezc3d::Matrix33 _refFrame; ///< The reference frame of the force plate in the
                             ///< global reference frame
  std::vector<ezc3d::Vector3d>
      _F; ///< Force vectors for all instants (including subframes) in global
          ///< reference frame
  std::vector<ezc3d::Vector3d>
      _M; ///< Moment vectors for all instants (including subframes) in global
          ///< reference frame
  std::vector<ezc3d::Vector3d>
      _CoP; ///< Center of Pressure vectors for all instants (including
            ///< subframes) in global reference frame
  std::vector<ezc3d::Vector3d>
      _Tz; ///< Moment [0, 0, Tz] vectors for all instants (including subframes)
           ///< expressed at the CoP

  std::vector<double>
      _type3copPoly; ///< The polynomial coefficients of the Kistler platforms

public:
  ///
  /// \brief Returns the number of frame recorded
  /// \return The number of frame recorded
  ///
  EZC3D_API size_t nbFrames() const;

  ///
  /// \brief Returns the type of the force platform
  /// \return The type of the force platform
  ///
  EZC3D_API size_t type() const;

  ///
  /// \brief Returns the calibration matrix
  /// \return The calibration matrix
  ///
  EZC3D_API const ezc3d::Matrix66 &calMatrix() const;

  ///
  /// \brief Returns the corners of the force platform
  /// \return The corners of the force platform
  ///
  EZC3D_API const std::vector<ezc3d::Vector3d> &corners() const;

  ///
  /// \brief Returns the geometrical center of the force platform
  /// \return The geometrical center of the force platform
  ///
  EZC3D_API const ezc3d::Vector3d &meanCorners() const;

  ///
  /// \brief Returns the origin of the force platform
  /// \return The origin of the force platform
  ///
  EZC3D_API const ezc3d::Vector3d &origin() const;

  ///
  /// \brief Returns the force vectors at each frame in the global reference
  /// frame \return The force vectors at each frame in the global reference
  /// frame
  ///
  EZC3D_API const std::vector<ezc3d::Vector3d> &forces() const;

  ///
  /// \brief Returns the moment vectors at each frame in the global reference
  /// frame at origin \return The moment vectors at each frame in the global
  /// reference frame at origin
  ///
  EZC3D_API const std::vector<ezc3d::Vector3d> &moments() const;

  ///
  /// \brief Returns the center of pressure at each frame in the global
  /// reference frame \return The center of pressure at each frame in the global
  /// reference frame at origin
  ///
  EZC3D_API const std::vector<ezc3d::Vector3d> &CoP() const;

  ///
  /// \brief Returns the moments at each frame in the global reference frame at
  /// center of pressure \return The moments at each frame in the global
  /// reference frame at center of pressure
  ///
  EZC3D_API const std::vector<ezc3d::Vector3d> &Tz() const;

protected:
  ///
  /// \brief Extract the force platform's type from the parameters
  /// \param idx Index of the platform
  /// \param c3d A reference to the c3d
  ///
  void extractType(size_t idx, const ezc3d::c3d &c3d);

  ///
  /// \brief Extract the corner positions from the parameters
  /// \param idx Index of the platform
  /// \param c3d A reference to the c3d
  ///
  void extractCorners(size_t idx, const ezc3d::c3d &c3d);

  ///
  /// \brief Extract the origin position from the parameters
  /// \param idx Index of the platform
  /// \param c3d A reference to the c3d
  ///
  void extractOrigin(size_t idx, const ezc3d::c3d &c3d);

  ///
  /// \brief Extract the calibration matrix from the parameters
  /// \param idx Index of the platform
  /// \param c3d A reference to the c3d
  ///
  void extractCalMatrix(size_t idx, const ezc3d::c3d &c3d);

  ///
  /// \brief From the position of the force platform, construct the reference
  /// frame
  ///
  void computePfReferenceFrame();

  ///
  /// \brief Extract the platform data from the c3d
  /// \param idx Index of the platform
  /// \param c3d A reference to the c3d
  ///
  void extractData(size_t idx, const ezc3d::c3d &c3d);
}